

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ToastOverlay.cpp
# Opt level: O3

void __thiscall cursespp::ToastOverlay::RecalculateSize(ToastOverlay *this)

{
  utf8 *this_00;
  size_type sVar1;
  int iVar2;
  int iVar3;
  back_insert_iterator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  in_RCX;
  int iVar4;
  undefined1 local_68 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  pointer local_38;
  
  local_68._8_8_ = (pointer)0x0;
  local_68._16_8_ = local_68._16_8_ & 0xffffffff00000000;
  this_00 = (utf8 *)(this->title)._M_dataplus._M_p;
  local_68._0_8_ = (pointer)(local_68 + 0x10);
  utf8::
  utf8to16<std::back_insert_iterator<std::__cxx11::wstring>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
            (this_00,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )(this_00 + (this->title)._M_string_length),
             (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )local_68,in_RCX);
  iVar2 = wcswidth((wchar_t *)local_68._0_8_,local_68._8_8_);
  sVar1 = (this->title)._M_string_length;
  if ((pointer)local_68._0_8_ != (pointer)(local_68 + 0x10)) {
    operator_delete((void *)local_68._0_8_,local_68._16_8_ * 4 + 4);
  }
  iVar3 = (int)sVar1;
  if (0 < iVar2) {
    iVar3 = iVar2;
  }
  iVar2 = Screen::GetWidth();
  iVar2 = (iVar2 << 2) / 5;
  if (iVar3 + 4 <= iVar2) {
    iVar2 = iVar3 + 4;
  }
  this->width = iVar2;
  text::BreakLines((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_48,&this->title,(long)(iVar2 + -4));
  local_68._16_8_ =
       (this->titleLines).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->titleLines).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = local_38;
  local_68._0_8_ =
       (this->titleLines).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_68._8_8_ =
       (this->titleLines).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (this->titleLines).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_48._M_allocated_capacity;
  (this->titleLines).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_48._8_8_;
  local_48._M_allocated_capacity = 0;
  local_48._8_8_ = 0;
  local_38 = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_68);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_48);
  iVar4 = (int)((ulong)((long)(this->titleLines).
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->titleLines).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 5) + 2;
  iVar3 = Screen::GetHeight();
  iVar2 = iVar3 + -4;
  if (iVar4 <= iVar3 + -4) {
    iVar2 = iVar4;
  }
  this->height = iVar2;
  iVar2 = Screen::GetWidth();
  this->x = iVar2 / 2 - this->width / 2;
  this->y = 2;
  return;
}

Assistant:

void ToastOverlay::RecalculateSize() {
    int cols = (int) u8cols(this->title);
    this->width = std::min(cols + 4, (Screen::GetWidth() * 4) / 5);
    this->titleLines = text::BreakLines(this->title, this->width - 4);
    this->height = std::min((int) this->titleLines.size() + 2, Screen::GetHeight() - 4);
    this->x = (Screen::GetWidth() / 2) - (this->width / 2);
    this->y = 2;
}